

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzer.cpp
# Opt level: O3

void __thiscall SimpleSerialAnalyzer::SetupResults(SimpleSerialAnalyzer *this)

{
  SimpleSerialAnalyzerResults *pSVar1;
  SimpleSerialAnalyzerResults *this_00;
  
  this_00 = (SimpleSerialAnalyzerResults *)operator_new(0x20);
  SimpleSerialAnalyzerResults::SimpleSerialAnalyzerResults(this_00,this,&this->mSettings);
  pSVar1 = (this->mResults)._M_t.
           super___uniq_ptr_impl<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>
           ._M_t.
           super__Tuple_impl<0UL,_SimpleSerialAnalyzerResults_*,_std::default_delete<SimpleSerialAnalyzerResults>_>
           .super__Head_base<0UL,_SimpleSerialAnalyzerResults_*,_false>._M_head_impl;
  (this->mResults)._M_t.
  super___uniq_ptr_impl<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>
  ._M_t.
  super__Tuple_impl<0UL,_SimpleSerialAnalyzerResults_*,_std::default_delete<SimpleSerialAnalyzerResults>_>
  .super__Head_base<0UL,_SimpleSerialAnalyzerResults_*,_false>._M_head_impl = this_00;
  if (pSVar1 != (SimpleSerialAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pSVar1 + 8))();
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn
            ((Channel *)
             (this->mResults)._M_t.
             super___uniq_ptr_impl<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>
             ._M_t.
             super__Tuple_impl<0UL,_SimpleSerialAnalyzerResults_*,_std::default_delete<SimpleSerialAnalyzerResults>_>
             .super__Head_base<0UL,_SimpleSerialAnalyzerResults_*,_false>._M_head_impl);
  return;
}

Assistant:

void SimpleSerialAnalyzer::SetupResults()
{
	// SetupResults is called each time the analyzer is run. Because the same instance can be used for multiple runs, we need to clear the results each time.
	mResults.reset(new SimpleSerialAnalyzerResults( this, &mSettings ));
	SetAnalyzerResults( mResults.get() );
	mResults->AddChannelBubblesWillAppearOn( mSettings.mInputChannel );
}